

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

void update_monsters(_Bool full)

{
  wchar_t wVar1;
  wchar_t wVar2;
  monster_conflict *mon;
  
  wVar1 = cave_monster_max(cave);
  if (L'\x01' < wVar1) {
    wVar1 = L'\x01';
    do {
      mon = (monster_conflict *)cave_monster(cave,wVar1);
      if (mon->race != (monster_race *)0x0) {
        update_mon(mon,(chunk *)cave,full);
      }
      wVar1 = wVar1 + L'\x01';
      wVar2 = cave_monster_max(cave);
    } while (wVar1 < wVar2);
  }
  return;
}

Assistant:

void update_monsters(bool full)
{
	int i;

	/* Update each (live) monster */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Update the monster if alive */
		if (mon->race)
			update_mon(mon, cave, full);
	}
}